

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PNM_Image.cxx
# Opt level: O0

void __thiscall Fl_PNM_Image::Fl_PNM_Image(Fl_PNM_Image *this,char *name)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  FILE *__stream;
  long lVar8;
  size_t sVar9;
  uchar *puVar10;
  bool bVar11;
  int local_448;
  uint local_444;
  int maxval;
  int val;
  int format;
  uchar bit;
  uchar byte;
  uchar *ptr;
  char *lineptr;
  char line [1024];
  int y;
  int x;
  FILE *fp;
  char *name_local;
  Fl_PNM_Image *this_local;
  
  Fl_RGB_Image::Fl_RGB_Image(&this->super_Fl_RGB_Image,(uchar *)0x0,0,0,3,0);
  (this->super_Fl_RGB_Image).super_Fl_Image._vptr_Fl_Image =
       (_func_int **)&PTR__Fl_PNM_Image_002efbf8;
  __stream = (FILE *)fl_fopen(name,"rb");
  if (__stream == (FILE *)0x0) {
    Fl_Image::ld((Fl_Image *)this,-2);
  }
  else {
    ptr = (uchar *)fgets((char *)&lineptr,0x400,__stream);
    if (ptr == (uchar *)0x0) {
      fclose(__stream);
      (*Fl::error)("Early end-of-file in PNM file \"%s\"!",name);
      Fl_Image::ld((Fl_Image *)this,-2);
    }
    else {
      ptr = ptr + 1;
      maxval = atoi((char *)ptr);
      while (iVar3 = isdigit((int)(char)*ptr), iVar3 != 0) {
        ptr = ptr + 1;
      }
      if (maxval == 7) {
        ptr = "";
      }
      while( true ) {
        bVar11 = false;
        if (ptr != (uchar *)0x0) {
          iVar3 = Fl_Image::w((Fl_Image *)this);
          bVar11 = iVar3 == 0;
        }
        if (!bVar11) break;
        if ((*ptr == '\0') || (*ptr == '#')) {
          ptr = (uchar *)fgets((char *)&lineptr,0x400,__stream);
        }
        else {
          iVar3 = isdigit((int)(char)*ptr);
          if (iVar3 == 0) {
            ptr = ptr + 1;
          }
          else {
            lVar8 = strtol((char *)ptr,(char **)&ptr,10);
            Fl_Image::w((Fl_Image *)this,(int)lVar8);
          }
        }
      }
      while( true ) {
        bVar11 = false;
        if (ptr != (uchar *)0x0) {
          iVar3 = Fl_Image::h((Fl_Image *)this);
          bVar11 = iVar3 == 0;
        }
        if (!bVar11) break;
        if ((*ptr == '\0') || (*ptr == '#')) {
          ptr = (uchar *)fgets((char *)&lineptr,0x400,__stream);
        }
        else {
          iVar3 = isdigit((int)(char)*ptr);
          if (iVar3 == 0) {
            ptr = ptr + 1;
          }
          else {
            lVar8 = strtol((char *)ptr,(char **)&ptr,10);
            Fl_Image::h((Fl_Image *)this,(int)lVar8);
          }
        }
      }
      if ((maxval == 1) || (maxval == 4)) {
        local_448 = 1;
      }
      else {
        local_448 = 0;
        while (ptr != (uchar *)0x0 && local_448 == 0) {
          if ((*ptr == '\0') || (*ptr == '#')) {
            ptr = (uchar *)fgets((char *)&lineptr,0x400,__stream);
          }
          else {
            iVar3 = isdigit((int)(char)*ptr);
            if (iVar3 == 0) {
              ptr = ptr + 1;
            }
            else {
              lVar8 = strtol((char *)ptr,(char **)&ptr,10);
              local_448 = (int)lVar8;
            }
          }
        }
      }
      if ((((maxval == 1) || (maxval == 2)) || (maxval == 4)) || (maxval == 5)) {
        Fl_Image::d((Fl_Image *)this,1);
      }
      else {
        Fl_Image::d((Fl_Image *)this,3);
      }
      iVar3 = Fl_Image::w((Fl_Image *)this);
      iVar4 = Fl_Image::h((Fl_Image *)this);
      iVar5 = Fl_Image::d((Fl_Image *)this);
      sVar9 = Fl_RGB_Image::max_size();
      if (sVar9 < (ulong)((long)iVar3 * (long)iVar4 * (long)iVar5)) {
        (*Fl::warning)("PNM file \"%s\" is too large!\n");
        fclose(__stream);
        Fl_Image::w((Fl_Image *)this,0);
        Fl_Image::h((Fl_Image *)this,0);
        Fl_Image::d((Fl_Image *)this,0);
        Fl_Image::ld((Fl_Image *)this,-3);
      }
      else {
        iVar3 = Fl_Image::w((Fl_Image *)this);
        iVar4 = Fl_Image::h((Fl_Image *)this);
        iVar5 = Fl_Image::d((Fl_Image *)this);
        puVar10 = (uchar *)operator_new__((long)(iVar3 * iVar4 * iVar5));
        (this->super_Fl_RGB_Image).array = puVar10;
        (this->super_Fl_RGB_Image).alloc_array = 1;
        line[0x3f8] = '\0';
        line[0x3f9] = '\0';
        line[0x3fa] = '\0';
        line[0x3fb] = '\0';
        for (; uVar1 = line._1016_4_, iVar3 = Fl_Image::h((Fl_Image *)this), uVar2 = line._1016_4_,
            (int)uVar1 < iVar3; line._1016_4_ = line._1016_4_ + 1) {
          puVar10 = (this->super_Fl_RGB_Image).array;
          iVar3 = Fl_Image::w((Fl_Image *)this);
          iVar4 = Fl_Image::d((Fl_Image *)this);
          puVar10 = puVar10 + uVar2 * iVar3 * iVar4;
          _format = puVar10;
          switch(maxval) {
          case 1:
            for (line._1020_4_ = Fl_Image::w((Fl_Image *)this); 0 < (int)line._1020_4_;
                line._1020_4_ = line._1020_4_ + -1) {
              iVar3 = __isoc99_fscanf(__stream,"%d",&local_444);
              if (iVar3 == 1) {
                *_format = -('\x01' - (char)local_444);
                _format = _format + 1;
              }
            }
            break;
          case 2:
            for (line._1020_4_ = Fl_Image::w((Fl_Image *)this); 0 < (int)line._1020_4_;
                line._1020_4_ = line._1020_4_ + -1) {
              iVar3 = __isoc99_fscanf(__stream,"%d",&local_444);
              if (iVar3 == 1) {
                *_format = (uchar)((int)(local_444 * 0xff) / local_448);
                _format = _format + 1;
              }
            }
            break;
          case 3:
            for (line._1020_4_ = Fl_Image::w((Fl_Image *)this); 0 < (int)line._1020_4_;
                line._1020_4_ = line._1020_4_ + -1) {
              iVar3 = __isoc99_fscanf(__stream,"%d",&local_444);
              if (iVar3 == 1) {
                *_format = (uchar)((int)(local_444 * 0xff) / local_448);
                _format = _format + 1;
              }
              iVar3 = __isoc99_fscanf(__stream,"%d",&local_444);
              if (iVar3 == 1) {
                *_format = (uchar)((int)(local_444 * 0xff) / local_448);
                _format = _format + 1;
              }
              iVar3 = __isoc99_fscanf(__stream,"%d",&local_444);
              if (iVar3 == 1) {
                *_format = (uchar)((int)(local_444 * 0xff) / local_448);
                _format = _format + 1;
              }
            }
            break;
          case 4:
            line._1020_4_ = Fl_Image::w((Fl_Image *)this);
            iVar3 = getc(__stream);
            val._3_1_ = (byte)iVar3;
            val._2_1_ = 0x80;
            for (; 0 < (int)line._1020_4_; line._1020_4_ = line._1020_4_ + -1) {
              if ((val._3_1_ & val._2_1_) == 0) {
                *_format = 0xff;
              }
              else {
                *_format = '\0';
              }
              _format = _format + 1;
              if (val._2_1_ < 2) {
                val._2_1_ = 0x80;
                if (1 < (int)line._1020_4_) {
                  iVar3 = getc(__stream);
                  val._3_1_ = (byte)iVar3;
                }
              }
              else {
                val._2_1_ = (byte)((int)(uint)val._2_1_ >> 1);
              }
            }
            break;
          case 5:
          case 6:
            if (local_448 < 0x100) {
              iVar3 = Fl_Image::w((Fl_Image *)this);
              iVar4 = Fl_Image::d((Fl_Image *)this);
              fread(puVar10,(long)iVar3,(long)iVar4,__stream);
            }
            else {
              iVar3 = Fl_Image::d((Fl_Image *)this);
              iVar4 = Fl_Image::w((Fl_Image *)this);
              for (line._1020_4_ = iVar3 * iVar4; 0 < (int)line._1020_4_;
                  line._1020_4_ = line._1020_4_ + -1) {
                local_444 = getc(__stream);
                local_444 = local_444 & 0xff;
                uVar7 = local_444 << 8;
                uVar6 = getc(__stream);
                local_444 = uVar7 | uVar6 & 0xff;
                *_format = (uchar)((int)(local_444 * 0xff) / local_448);
                _format = _format + 1;
              }
            }
            break;
          case 7:
            for (line._1020_4_ = Fl_Image::w((Fl_Image *)this); 0 < (int)line._1020_4_;
                line._1020_4_ = line._1020_4_ + -1) {
              uVar7 = getc(__stream);
              val._3_1_ = (byte)uVar7;
              *_format = (uchar)((ulong)(uint)(((int)(uVar7 & 0xff) >> 5) * 0xff) / 7);
              puVar10 = _format + 2;
              _format[1] = (uchar)((ulong)(((int)(uVar7 & 0xff) >> 2 & 7U) * 0xff) / 7);
              _format = _format + 3;
              *puVar10 = (uchar)((ulong)((uVar7 & 3) * 0xff) / 3);
            }
          }
        }
        fclose(__stream);
      }
    }
  }
  return;
}

Assistant:

Fl_PNM_Image::Fl_PNM_Image(const char *name)	// I - File to read
  : Fl_RGB_Image(0,0,0) {
  FILE		*fp;		// File pointer
  int		x, y;		// Looping vars
  char		line[1024],	// Input line
		*lineptr;	// Pointer in line
  uchar		*ptr,		// Pointer to pixel values
		byte,		// Byte from file
		bit;		// Bit in pixel
  int		format,		// Format of PNM file
		val,		// Pixel value
		maxval;		// Maximum pixel value


  if ((fp = fl_fopen(name, "rb")) == NULL) {
    ld(ERR_FILE_ACCESS);
    return;
  }

  //
  // Read the file header in the format:
  //
  //   Pformat
  //   # comment1
  //   # comment2
  //   ...
  //   # commentN
  //   width
  //   height
  //   max sample
  //

  lineptr = fgets(line, sizeof(line), fp);
  if (!lineptr) {
    fclose(fp);
    Fl::error("Early end-of-file in PNM file \"%s\"!", name);
    ld(ERR_FILE_ACCESS);
    return;
  }

  lineptr ++;

  format = atoi(lineptr);
  while (isdigit(*lineptr)) lineptr ++;

  if (format == 7) lineptr = (char *)"";

  while (lineptr != NULL && w() == 0) {
    if (*lineptr == '\0' || *lineptr == '#') {
      lineptr = fgets(line, sizeof(line), fp);
    } else if (isdigit(*lineptr)) {
      w(strtol(lineptr, &lineptr, 10));
    } else lineptr ++;
  }

  while (lineptr != NULL && h() == 0) {
    if (*lineptr == '\0' || *lineptr == '#') {
      lineptr = fgets(line, sizeof(line), fp);
    } else if (isdigit(*lineptr)) {
      h(strtol(lineptr, &lineptr, 10));
    } else lineptr ++;
  }

  if (format != 1 && format != 4) {
    maxval = 0;

    while (lineptr != NULL && maxval == 0) {
      if (*lineptr == '\0' || *lineptr == '#') {
	lineptr = fgets(line, sizeof(line), fp);
      } else if (isdigit(*lineptr)) {
	maxval = strtol(lineptr, &lineptr, 10);
      } else lineptr ++;
    }
  } else maxval = 1;

  // Allocate memory...
  if (format == 1 || format == 2 || format == 4 || format == 5) d(1);
  else d(3);

//  printf("%s = %dx%dx%d\n", name, w(), h(), d());

  if (((size_t)w()) * h() * d() > max_size() ) {
    Fl::warning("PNM file \"%s\" is too large!\n", name);
    fclose(fp);
    w(0); h(0); d(0); ld(ERR_FORMAT);
    return;
  }
  array       = new uchar[w() * h() * d()];
  alloc_array = 1;

  // Read the image file...
  for (y = 0; y < h(); y ++) {
    ptr = (uchar *)array + y * w() * d();

    switch (format) {
      case 1 :
        for (x = w(); x > 0; x --)
          if (fscanf(fp, "%d", &val) == 1) *ptr++ = (uchar)(255 * (1-val));
        break;
        
      case 2 :
          for (x = w(); x > 0; x --)
            if (fscanf(fp, "%d", &val) == 1) *ptr++ = (uchar)(255 * val / maxval);
          break;

      case 3 :
          for (x = w(); x > 0; x --) {
            if (fscanf(fp, "%d", &val) == 1) *ptr++ = (uchar)(255 * val / maxval);
            if (fscanf(fp, "%d", &val) == 1) *ptr++ = (uchar)(255 * val / maxval);
            if (fscanf(fp, "%d", &val) == 1) *ptr++ = (uchar)(255 * val / maxval);
          }
          break;

      case 4 :
        for (x = w(), byte = (uchar)getc(fp), bit = 128; x > 0; x --) {
          if ((byte & bit) == 0) *ptr++ = 255; // 0 bit for white pixel
          else *ptr++ = 0; // 1 bit for black pixel
          
          if (bit > 1) bit >>= 1;
          else {
            bit  = 128;
            if (x > 1) byte = (uchar)getc(fp);
          }
        }
        break;
          
      case 5 :
      case 6 :
        if (maxval < 256) {
          if (fread(ptr, w(), d(), fp)) { /* ignored */ }
        } else {
          for (x = d() * w(); x > 0; x --) {
            val = (uchar)getc(fp);
            val = (val<<8)|(uchar)getc(fp);
            *ptr++ = (255*val)/maxval;
          }
        }
        break;
        
      case 7 : /* XV 3:3:2 thumbnail format */
        for (x = w(); x > 0; x --) {
          byte = (uchar)getc(fp);
          
          *ptr++ = (uchar)(255 * ((byte >> 5) & 7) / 7);
          *ptr++ = (uchar)(255 * ((byte >> 2) & 7) / 7);
          *ptr++ = (uchar)(255 * (byte & 3) / 3);
        }
        break;
    }
  }

  fclose(fp);
}